

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Bucket::advance_impl
          (Bucket *this,Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *d,Span *whenAtEnd)

{
  Span *whenAtEnd_local;
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *d_local;
  Bucket *this_local;
  
  this->index = this->index + 1;
  if (this->index == 0x80) {
    this->index = 0;
    this->span = this->span + 1;
    if (((long)this->span - (long)d->spans) / 0x90 == d->numBuckets >> 7) {
      this->span = whenAtEnd;
    }
  }
  return;
}

Assistant:

void advance_impl(const Data *d, Span *whenAtEnd) noexcept
        {
            Q_ASSERT(span);
            ++index;
            if (Q_UNLIKELY(index == SpanConstants::NEntries)) {
                index = 0;
                ++span;
                if (span - d->spans == ptrdiff_t(d->numBuckets >> SpanConstants::SpanShift))
                    span = whenAtEnd;
            }
        }